

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_pcm_u8_to_s32(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  ma_dither_mode ditherMode_local;
  ma_uint64 count_local;
  void *src_local;
  void *dst_local;
  ulong uStack_40;
  ma_int32 x;
  ma_uint64 i;
  ma_uint8 *src_u8;
  ma_int32 *dst_s32;
  
  for (uStack_40 = 0; uStack_40 < count; uStack_40 = uStack_40 + 1) {
    *(uint *)((long)dst + uStack_40 * 4) = (*(byte *)((long)src + uStack_40) - 0x80) * 0x1000000;
  }
  return;
}

Assistant:

MA_API void ma_pcm_u8_to_s32(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_u8_to_s32__reference(dst, src, count, ditherMode);
#else
    #  if MA_PREFERRED_SIMD == MA_SIMD_AVX2
        if (ma_has_avx2()) {
            ma_pcm_u8_to_s32__avx2(dst, src, count, ditherMode);
        } else
    #elif MA_PREFERRED_SIMD == MA_SIMD_SSE2
        if (ma_has_sse2()) {
            ma_pcm_u8_to_s32__sse2(dst, src, count, ditherMode);
        } else
    #elif MA_PREFERRED_SIMD == MA_SIMD_NEON
        if (ma_has_neon()) {
            ma_pcm_u8_to_s32__neon(dst, src, count, ditherMode);
        } else
    #endif
        {
            ma_pcm_u8_to_s32__optimized(dst, src, count, ditherMode);
        }
#endif
}